

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

void nbt_free_list(nbt_list *list)

{
  nbt_list *entry;
  list_head *temp;
  list_head *current;
  nbt_list *list_local;
  
  if (list != (nbt_list *)0x0) {
    temp = (list->entry).flink;
    entry = (nbt_list *)temp->flink;
    while (temp != &list->entry) {
      nbt_free((nbt_node *)temp[-1].flink);
      free(&temp[-1].flink);
      temp = (list_head *)entry;
      entry = (nbt_list *)(entry->entry).blink;
    }
    free(list->data);
    free(list);
  }
  return;
}

Assistant:

void nbt_free_list(struct nbt_list* list)
{
    if (!list)
        return;

    struct list_head* current;
    struct list_head* temp;
    list_for_each_safe(current, temp, &list->entry)
    {
        struct nbt_list* entry = list_entry(current, struct nbt_list, entry);

        nbt_free(entry->data);
        free(entry);
    }

    free(list->data);
    free(list);
}